

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
cs::method_import_as::preprocess
          (method_import_as *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  iterator *piVar1;
  value_type ptVar2;
  value_type ptVar3;
  token_base *ptVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Elt_pointer pdVar7;
  _Elt_pointer ppsVar8;
  int iVar9;
  const_reference pptVar10;
  token_base **pptVar11;
  statement_import *psVar12;
  internal_error *this_00;
  compile_error *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Elt_pointer pptVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>
  __l;
  var ext;
  allocator_type local_89;
  undefined1 local_88 [8];
  undefined1 local_80 [32];
  any local_60;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  local_58;
  statement_import *local_38;
  
  pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                       ((raw->
                        super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                        )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar2 = *pptVar10;
  pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                       ((raw->
                        super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                        )._M_impl.super__Deque_impl_data._M_start._M_cur,3);
  ptVar3 = *pptVar10;
  local_80._0_8_ = ptVar2[1]._vptr_token_base;
  pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_80);
  if (*pptVar11 != (token_base *)0x0) {
    local_88 = (undefined1  [8])ptVar3[1]._vptr_token_base;
    pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
    if (*pptVar11 != (token_base *)0x0) {
      local_80._0_8_ = ptVar3[1]._vptr_token_base;
      pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_80);
      ptVar4 = *pptVar11;
      iVar9 = (*ptVar4->_vptr_token_base[2])(ptVar4);
      if (iVar9 == 4) {
        get_namespace((method_import_as *)local_88,(context_t *)this,(iterator)context);
        compiler_type::add_constant
                  ((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->compiler).
                   super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (var *)local_88);
        name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ptVar4 + 3);
        domain_manager::add_var_no_return<std::__cxx11::string_const&>
                  (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->instance).
                      super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_runtime_type).storage,name,(var *)local_88);
        psVar12 = (statement_import *)
                  statement_base::operator_new((statement_base *)0x38,(size_t)name);
        local_80._0_8_ = (tree_node *)(local_80 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_80,ptVar4[3]._vptr_token_base,
                   ptVar4[3].line_num + (long)ptVar4[3]._vptr_token_base);
        if (local_88 != (undefined1  [8])0x0) {
          *(tree_node **)((long)local_88 + 8) =
               (tree_node *)((long)&(*(tree_node **)((long)local_88 + 8))->root + 1);
        }
        local_60.mDat = (proxy *)local_88;
        __l._M_len = 1;
        __l._M_array = (iterator)local_80;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
        ::vector(&local_58,__l,&local_89);
        peVar5 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var6 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        pdVar7 = (raw->
                 super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar13 = (pdVar7->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar13 ==
            (pdVar7->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_first) {
          pptVar13 = (pdVar7->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                     )._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        ptVar4 = pptVar13[-1];
        (psVar12->super_statement_base).context.
        super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
        (psVar12->super_statement_base).context.
        super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var6;
        (psVar12->super_statement_base).line_num = ptVar4->line_num;
        (psVar12->super_statement_base)._vptr_statement_base =
             (_func_int **)&PTR__statement_import_002510d0;
        (psVar12->m_var_list).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_58.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (psVar12->m_var_list).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_58.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (psVar12->m_var_list).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_58.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_58.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ppsVar8 = (this->mResult).
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_38 = psVar12;
        if (ppsVar8 ==
            (this->mResult).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
          _M_push_back_aux<cs::statement_import*>
                    ((deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)
                     &this->mResult,&local_38);
        }
        else {
          *ppsVar8 = (statement_base *)psVar12;
          piVar1 = &(this->mResult).
                    super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                    _M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
        ::~vector(&local_58);
        cs_impl::any::recycle(&local_60);
        if ((tree_node *)local_80._0_8_ != (tree_node *)(local_80 + 0x10)) {
          operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
        }
        cs_impl::any::recycle((any *)local_88);
        return;
      }
      this_01 = (compile_error *)__cxa_allocate_exception(0x28);
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_80,"Wrong grammar for import-as statement, expect <id> in alias.",
                 "");
      compile_error::compile_error(this_01,(string *)local_80);
      __cxa_throw(this_01,&compile_error::typeinfo,compile_error::~compile_error);
    }
  }
  this_00 = (internal_error *)__cxa_allocate_exception(0x28);
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"Null pointer accessed.","");
  internal_error::internal_error(this_00,(string *)local_80);
  __cxa_throw(this_00,&internal_error::typeinfo,internal_error::~internal_error);
}

Assistant:

void method_import_as::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree_package = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		tree_type<token_base *> &tree_alias = static_cast<token_expr *>(raw.front().at(3))->get_tree();
		if (tree_package.root().data() == nullptr || tree_alias.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		token_base *token_alias = tree_alias.root().data();
		if (token_alias->get_type() != token_types::id)
			throw compile_error("Wrong grammar for import-as statement, expect <id> in alias.");
		const string &alias_name = static_cast<token_id *>(token_alias)->get_id().get_id();
		var ext = get_namespace(context, tree_package.root());
		context->compiler->add_constant(ext);
		context->instance->storage.add_var_no_return(alias_name, ext);
		mResult.emplace_back(new statement_import({{alias_name, ext}}, context, raw.front().back()));
	}